

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

BaseType_conflict3 computeThreshold<Imath_3_2::Matrix33<double>>(Matrix33<double> *A)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  Matrix33<double> *in_RDI;
  Matrix33<double> *pMVar4;
  T eps;
  uint j;
  uint i;
  T maxAbsEntry;
  double local_28;
  double local_20;
  uint local_18;
  uint local_14;
  double local_10;
  Matrix33<double> *local_8;
  
  local_10 = 0.0;
  local_14 = 0;
  local_8 = in_RDI;
  while( true ) {
    uVar1 = local_14;
    uVar2 = Imath_3_2::Matrix33<double>::dimensions();
    if (uVar2 <= uVar1) break;
    local_18 = 0;
    while( true ) {
      uVar1 = local_18;
      uVar2 = Imath_3_2::Matrix33<double>::dimensions();
      if (uVar2 <= uVar1) break;
      pMVar4 = local_8;
      Imath_3_2::Matrix33<double>::operator[](local_8,local_14);
      std::abs((int)pMVar4);
      pdVar3 = std::max<double>(&local_10,&local_20);
      local_10 = *pdVar3;
      local_18 = local_18 + 1;
    }
    local_14 = local_14 + 1;
  }
  local_28 = std::numeric_limits<double>::epsilon();
  pdVar3 = std::max<double>(&local_10,&local_28);
  return *pdVar3 * 100.0 * 2.220446049250313e-16;
}

Assistant:

typename TM::BaseType
computeThreshold (const TM& A)
{
    typedef typename TM::BaseType T;
    T                             maxAbsEntry (0);

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            maxAbsEntry = std::max (maxAbsEntry, std::abs (A[i][j]));

    const T eps = std::numeric_limits<T>::epsilon ();
    maxAbsEntry = std::max (maxAbsEntry, eps);

    return maxAbsEntry * T (100) * eps;
}